

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::AllocNodes(SQTable *this,SQInteger nSize)

{
  _HashNode *p_Var1;
  _HashNode *n;
  SQInteger i;
  _HashNode *nodes;
  SQInteger nSize_local;
  SQTable *this_local;
  
  p_Var1 = (_HashNode *)sq_vm_malloc(nSize * 0x28);
  for (n = (_HashNode *)0x0; (long)n < nSize;
      n = (_HashNode *)((long)&(n->val).super_SQObject._type + 1)) {
    _HashNode::_HashNode(p_Var1 + (long)n);
    p_Var1[(long)n].next = (_HashNode *)0x0;
  }
  this->_numofnodes = nSize;
  this->_nodes = p_Var1;
  this->_firstfree = this->_nodes + this->_numofnodes + -1;
  return;
}

Assistant:

void SQTable::AllocNodes(SQInteger nSize)
{
    _HashNode *nodes=(_HashNode *)SQ_MALLOC(sizeof(_HashNode)*nSize);
    for(SQInteger i=0;i<nSize;i++){
        _HashNode &n = nodes[i];
        new (&n) _HashNode;
        n.next=NULL;
    }
    _numofnodes=nSize;
    _nodes=nodes;
    _firstfree=&_nodes[_numofnodes-1];
}